

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

uint32_t readUINT32(ifstream *stream)

{
  undefined1 uVar1;
  undefined8 in_RAX;
  undefined1 *puVar2;
  long lVar3;
  uint32_t value;
  undefined4 local_4;
  
  local_4 = (uint32_t)((ulong)in_RAX >> 0x20);
  std::istream::read((char *)stream,(long)&local_4);
  puVar2 = (undefined1 *)((long)&local_4 + 3);
  lVar3 = 0;
  do {
    uVar1 = *(undefined1 *)((long)&local_4 + lVar3);
    *(undefined1 *)((long)&local_4 + lVar3) = *puVar2;
    *puVar2 = uVar1;
    lVar3 = lVar3 + 1;
    puVar2 = puVar2 + -1;
  } while (lVar3 != 2);
  return local_4;
}

Assistant:

uint32_t readUINT32(std::ifstream& stream)
{
    uint32_t value;
    char * buff = reinterpret_cast<char *>(&value);
    stream.read(buff, 4);
    std::reverse(buff, buff + 4);
    return value;
}